

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_7::Validator::CheckTypeIndex
          (Validator *this,Location *loc,Type actual,Type expected,char *desc,Index index,
          char *index_kind)

{
  char *pcVar1;
  char *pcVar2;
  
  if (actual == Any) {
    return;
  }
  if (expected == actual) {
    return;
  }
  if (expected == Any) {
    return;
  }
  pcVar1 = "i32";
  if (actual < Anyfunc) {
    if (actual == Void) {
      pcVar2 = "void";
    }
    else if (actual == Func) {
      pcVar2 = "func";
    }
    else {
      if (actual != ExceptRef) goto LAB_00f55e46;
      pcVar2 = "except_ref";
    }
  }
  else {
    pcVar2 = "i32";
    switch(actual) {
    case V128:
      pcVar2 = "v128";
      break;
    case F64:
      pcVar2 = "f64";
      break;
    case F32:
      pcVar2 = "f32";
      break;
    case I64:
      pcVar2 = "i64";
      break;
    case I32:
      break;
    default:
      if (actual == Anyfunc) {
        pcVar2 = "anyfunc";
      }
      else {
LAB_00f55e46:
        pcVar2 = "<type index>";
      }
    }
  }
  if (expected < Anyfunc) {
    if (expected == Void) {
      pcVar1 = "void";
      goto switchD_00f55e8b_caseD_ffffffff;
    }
    if (expected == Func) {
      pcVar1 = "func";
      goto switchD_00f55e8b_caseD_ffffffff;
    }
    if (expected == ExceptRef) {
      pcVar1 = "except_ref";
      goto switchD_00f55e8b_caseD_ffffffff;
    }
LAB_00f55ece:
    pcVar1 = "<type index>";
  }
  else {
    switch(expected) {
    case V128:
      pcVar1 = "v128";
      break;
    case F64:
      pcVar1 = "f64";
      break;
    case F32:
      pcVar1 = "f32";
      break;
    case I64:
      pcVar1 = "i64";
      break;
    case I32:
      break;
    default:
      if (expected == Anyfunc) {
        pcVar1 = "anyfunc";
        break;
      }
      goto LAB_00f55ece;
    }
  }
switchD_00f55e8b_caseD_ffffffff:
  PrintError(this,loc,"type mismatch for %s %u of %s. got %s, expected %s",index_kind,index,desc,
             pcVar2,pcVar1);
  return;
}

Assistant:

void Validator::CheckTypeIndex(const Location* loc,
                               Type actual,
                               Type expected,
                               const char* desc,
                               Index index,
                               const char* index_kind) {
  if (expected != actual && expected != Type::Any && actual != Type::Any) {
    PrintError(
        loc, "type mismatch for %s %" PRIindex " of %s. got %s, expected %s",
        index_kind, index, desc, GetTypeName(actual), GetTypeName(expected));
  }
}